

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::TestEventRepeater::OnTestIterationEnd
          (TestEventRepeater *this,UnitTest *unit_test,int iteration)

{
  TestEventListener *pTVar1;
  ulong uVar2;
  
  if (this->forwarding_enabled_ == true) {
    for (uVar2 = (ulong)((long)(this->listeners_).
                               super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->listeners_).
                              super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
        0 < (int)uVar2; uVar2 = uVar2 - 1) {
      pTVar1 = (this->listeners_).
               super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar2 - 1];
      (*pTVar1->_vptr_TestEventListener[0xd])(pTVar1,unit_test,(ulong)(uint)iteration);
    }
  }
  return;
}

Assistant:

void TestEventRepeater::OnTestIterationEnd(const UnitTest& unit_test,
                                           int iteration) {
  if (forwarding_enabled_) {
    for (int i = static_cast<int>(listeners_.size()) - 1; i >= 0; i--) {
      listeners_[i]->OnTestIterationEnd(unit_test, iteration);
    }
  }
}